

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void compute_jsstring_size(JSString *str,JSMemoryUsage_helper *hp)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  if (*(ulong *)&str->field_0x4 >> 0x3e == 0) {
    dVar3 = (double)(str->header).ref_count;
    hp->str_count = 1.0 / dVar3 + hp->str_count;
    uVar1 = *(uint *)&str->field_0x4;
    lVar2 = ((long)(int)((uVar1 & 0x7fffffff) << (byte)(uVar1 >> 0x1f)) - (ulong)((int)uVar1 < 0)) +
            0x11;
    auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = 0x45300000;
    hp->str_size = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / dVar3 +
                   hp->str_size;
  }
  return;
}

Assistant:

static void compute_jsstring_size(JSString *str, JSMemoryUsage_helper *hp)
{
    if (!str->atom_type) {  /* atoms are handled separately */
        double s_ref_count = str->header.ref_count;
        hp->str_count += 1 / s_ref_count;
        hp->str_size += ((sizeof(*str) + (str->len << str->is_wide_char) +
                          1 - str->is_wide_char) / s_ref_count);
    }
}